

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O3

JSON __thiscall anon_unknown.dwarf_469ee::JSONParser::parse(JSONParser *this)

{
  byte bVar1;
  lex_state_e lVar2;
  Reactor *pRVar3;
  element_type *peVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined8 this_00;
  int iVar10;
  parser_state_e pVar11;
  undefined4 extraout_var;
  byte *pbVar12;
  JSON *pJVar13;
  ulong uVar14;
  pointer pSVar15;
  pointer pSVar16;
  InputSource *pIVar17;
  undefined8 *puVar18;
  long *plVar19;
  logic_error *this_01;
  runtime_error *prVar20;
  undefined8 *extraout_RAX;
  char *pcVar21;
  char *pcVar22;
  ulong uVar23;
  size_type *psVar24;
  byte bVar25;
  uint uVar26;
  uint *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var27;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  code *pcVar29;
  byte *extraout_RDX_17;
  lex_state_e lVar30;
  long lVar31;
  pointer pSVar32;
  JSONParser *in_RSI;
  JSONParser *pJVar33;
  JSONParser *pJVar34;
  uint *puVar35;
  undefined *puVar36;
  long lVar37;
  JSONParser *pJVar38;
  pointer pSVar39;
  _Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
  *p_Var40;
  bool bVar41;
  JSON JVar42;
  JSON tos;
  undefined1 local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  undefined1 local_c8 [32];
  pointer local_a8;
  string local_a0;
  JSONParser *local_80;
  undefined1 local_78 [24];
  JSONParser *local_60;
  qpdf_offset_t *local_58;
  JSON local_50;
  JSON local_40;
  
  local_60 = this;
  if (in_RSI->done == false) {
    pJVar33 = (JSONParser *)&in_RSI->token;
    pcVar21 = in_RSI->buf;
    local_58 = &in_RSI->u_count;
    local_78._16_8_ = &in_RSI->dict_key;
    puVar35 = (uint *)in_RSI;
    local_80 = pJVar33;
    do {
      (in_RSI->token)._M_string_length = 0;
      *(in_RSI->token)._M_dataplus._M_p = '\0';
      pbVar12 = (byte *)in_RSI->p;
      lVar30 = ls_comma;
      pSVar39 = (pointer)0x0;
      pJVar38 = (JSONParser *)0x0;
LAB_001239ab:
      pcVar22 = pcVar21 + in_RSI->bytes;
      if (pbVar12 == (byte *)pcVar22) {
        in_RSI->p = pcVar21;
        pJVar34 = (JSONParser *)pcVar21;
        iVar10 = (*in_RSI->is->_vptr_InputSource[7])(in_RSI->is,pcVar21,0x4000);
        in_RSI->bytes = CONCAT44(extraout_var,iVar10);
        if (CONCAT44(extraout_var,iVar10) == 0) {
          in_RSI->done = true;
          in_RDX = (uint *)(ulong)in_RSI->lex_state;
          goto LAB_00123f54;
        }
        pbVar12 = (byte *)in_RSI->p;
        puVar35 = (uint *)pJVar34;
      }
      bVar1 = *pbVar12;
      pcVar22 = (char *)(ulong)bVar1;
      uVar26 = (uint)bVar1;
      pJVar34 = (JSONParser *)puVar35;
      if (bVar1 < 0x20) {
        if ((1 < bVar1 - 9) && (uVar26 != 0xd)) {
          prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_e8,in_RSI->offset);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128,"JSON: control or null character at offset ",&local_e8);
          std::runtime_error::runtime_error(prVar20,(string *)local_128);
          __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        in_RDX = (uint *)(ulong)in_RSI->lex_state;
LAB_00123a05:
        if ((int)in_RDX == 0) {
LAB_00123a0d:
          pbVar12 = pbVar12 + 1;
          in_RSI->p = (char *)pbVar12;
          lVar31 = in_RSI->offset;
          goto LAB_00123ccb;
        }
        goto LAB_00123f54;
      }
      lVar2 = in_RSI->lex_state;
      in_RDX = (uint *)(ulong)lVar2;
      if (0x5a < bVar1) {
        if (uVar26 == 0x7a || bVar1 < 0x7a) {
          if (bVar1 == 0x5b) {
            if (lVar2 == ls_string) {
              puVar35 = (uint *)0x5b;
              goto LAB_00123cae;
            }
            if (lVar2 == ls_top) {
              lVar31 = in_RSI->offset;
              in_RSI->token_start = lVar31;
              in_RSI->lex_state = ls_begin_array;
LAB_00123f1f:
              in_RSI->p = (char *)(pbVar12 + 1);
              in_RSI->offset = lVar31 + 1;
              goto LAB_00123f91;
            }
            goto LAB_00123f54;
          }
          if (bVar1 == 0x5d) {
            if (lVar2 != ls_string) {
              lVar30 = ls_end_array;
              goto LAB_00123f3a;
            }
            puVar35 = (uint *)0x5d;
            goto LAB_00123cae;
          }
LAB_00123ab7:
          if (ls_u4 < lVar2) {
switchD_00123ad0_caseD_b:
            prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error
                      ((logic_error *)prVar20,
                       "JSONParser::getToken : trying to handle delimiter state");
            goto LAB_00124b5b;
          }
          puVar35 = &switchD_00123ad0::switchdataD_0025d7c4;
          p_Var27 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&switchD_00123ad0::switchdataD_0025d7c4 +
                    (long)(int)(&switchD_00123ad0::switchdataD_0025d7c4)[(long)in_RDX]);
          switch(in_RDX) {
          case (uint *)0x0:
            lVar31 = in_RSI->offset;
            in_RSI->token_start = lVar31;
            bVar1 = *pbVar12;
            if (bVar1 != 0x22) {
              if ((byte)(bVar1 + 0x9f) < 0x1a) {
                in_RSI->lex_state = ls_alpha;
              }
              else {
                if (bVar1 != 0x2d) {
                  if ((byte)(bVar1 - 0x31) < 9) goto LAB_00123c02;
                  if (bVar1 != 0x30) {
                    prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::__cxx11::to_string(&local_a0,in_RSI->offset);
                    std::operator+(&local_108,"JSON: offset ",&local_a0);
                    plVar19 = (long *)std::__cxx11::string::append((char *)&local_108);
                    local_e8._M_dataplus._M_p = (pointer)*plVar19;
                    psVar24 = (size_type *)(plVar19 + 2);
                    if ((size_type *)local_e8._M_dataplus._M_p == psVar24) {
                      local_e8.field_2._M_allocated_capacity = *psVar24;
                      local_e8.field_2._8_8_ = plVar19[3];
                      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                    }
                    else {
                      local_e8.field_2._M_allocated_capacity = *psVar24;
                    }
                    local_e8._M_string_length = plVar19[1];
                    *plVar19 = (long)psVar24;
                    plVar19[1] = 0;
                    *(undefined1 *)(plVar19 + 2) = 0;
                    pcVar21 = in_RSI->p;
                    local_c8._0_8_ = local_c8 + 0x10;
                    if (pcVar21 == (char *)0x0) {
                      pcVar21 = (char *)std::__throw_logic_error
                                                  ("basic_string::_M_construct null not valid");
                    }
                    local_c8[0x10] = *pcVar21;
                    local_c8._8_8_ = (Reactor *)0x1;
                    local_c8[0x11] = ls_top >> 8;
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_128,&local_e8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_c8);
                    std::runtime_error::runtime_error(prVar20,(string *)local_128);
                    __cxa_throw(prVar20,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  goto LAB_00123c60;
                }
                in_RSI->lex_state = ls_number_minus;
              }
              break;
            }
            in_RSI->lex_state = ls_string;
            goto LAB_00123cc1;
          case (uint *)0x1:
            if ((byte)(bVar1 - 0x30) < 10) goto LAB_00123c52;
            goto LAB_001250c2;
          case (uint *)0x2:
            if ((byte)(bVar1 - 0x31) < 9) {
LAB_00123c02:
              in_RSI->lex_state = ls_number_before_point;
            }
            else {
              if (uVar26 != 0x30) {
                prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::to_string(&local_108,in_RSI->offset);
                std::operator+(&local_e8,"JSON: offset ",&local_108);
                plVar19 = (long *)std::__cxx11::string::append((char *)&local_e8);
                local_128._0_8_ = *plVar19;
                psVar24 = (size_type *)(plVar19 + 2);
                if ((size_type *)local_128._0_8_ == psVar24) {
                  local_128._16_8_ = *psVar24;
                  local_128._24_8_ = plVar19[3];
                  local_128._0_8_ = local_128 + 0x10;
                }
                else {
                  local_128._16_8_ = *psVar24;
                }
                local_128._8_8_ = plVar19[1];
                *plVar19 = (long)psVar24;
                plVar19[1] = 0;
                *(undefined1 *)(plVar19 + 2) = 0;
                std::runtime_error::runtime_error(prVar20,(string *)local_128);
                __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
LAB_00123c60:
              in_RSI->lex_state = ls_number_leading_zero;
            }
            break;
          case (uint *)0x3:
            if ((uVar26 == 0x65) || (uVar26 == 0x45)) {
LAB_00123ca1:
              in_RSI->lex_state = ls_number_e;
            }
            else {
              if (uVar26 != 0x2e) {
                prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::to_string(&local_108,in_RSI->offset);
                std::operator+(&local_e8,"JSON: offset ",&local_108);
                plVar19 = (long *)std::__cxx11::string::append((char *)&local_e8);
                local_128._0_8_ = *plVar19;
                psVar24 = (size_type *)(plVar19 + 2);
                if ((size_type *)local_128._0_8_ == psVar24) {
                  local_128._16_8_ = *psVar24;
                  local_128._24_8_ = plVar19[3];
                  local_128._0_8_ = local_128 + 0x10;
                }
                else {
                  local_128._16_8_ = *psVar24;
                }
                local_128._8_8_ = plVar19[1];
                *plVar19 = (long)psVar24;
                plVar19[1] = 0;
                *(undefined1 *)(plVar19 + 2) = 0;
                std::runtime_error::runtime_error(prVar20,(string *)local_128);
                __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
LAB_00123c35:
              in_RSI->lex_state = ls_number_point;
            }
            break;
          case (uint *)0x4:
            if ((byte)(bVar1 - 0x30) < 10) goto LAB_00123c52;
            if ((uVar26 == 0x65) || (uVar26 == 0x45)) goto LAB_00123ca1;
            if (uVar26 == 0x2e) goto LAB_00123c35;
            goto LAB_001250c2;
          case (uint *)0x5:
            pcVar22 = (char *)(ulong)(uVar26 - 0x30);
            if (9 < (byte)(uVar26 - 0x30)) goto LAB_001250c2;
            in_RSI->lex_state = ls_number_after_point;
            break;
          case (uint *)0x6:
            if ((byte)(bVar1 - 0x30) < 10) goto LAB_00123c52;
            pcVar22 = (char *)(ulong)(uVar26 | 0x20);
            if ((uVar26 | 0x20) == 0x65) goto LAB_00123ca1;
            goto LAB_001250c2;
          case (uint *)0x7:
            if ((byte)(bVar1 - 0x30) < 10) goto LAB_00123c16;
            if ((uVar26 != 0x2d) && (uVar26 != 0x2b)) goto LAB_001250c2;
            in_RSI->lex_state = ls_number_e_sign;
            break;
          case (uint *)0x8:
            pcVar22 = (char *)(ulong)(uVar26 - 0x30);
            if (9 < (byte)(uVar26 - 0x30)) goto LAB_001250c2;
LAB_00123c16:
            in_RSI->lex_state = ls_number;
            break;
          case (uint *)0x9:
            if ((byte)(bVar1 + 0x9f) < 0x1a) goto LAB_00123c52;
            goto LAB_001250c2;
          case (uint *)0xa:
            if (bVar1 == 0x5c) {
              in_RSI->lex_state = ls_backslash;
              goto LAB_00123a0d;
            }
            if (bVar1 == 0x22) {
              lVar30 = ls_after_string;
              if (pSVar39 != (pointer)0x0) {
                prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::to_string(&local_108,(longlong)pSVar39);
                std::operator+(&local_e8,"JSON: offset ",&local_108);
                plVar19 = (long *)std::__cxx11::string::append((char *)&local_e8);
                local_128._0_8_ = *plVar19;
                psVar24 = (size_type *)(plVar19 + 2);
                if ((size_type *)local_128._0_8_ == psVar24) {
                  local_128._16_8_ = *psVar24;
                  local_128._24_8_ = plVar19[3];
                  local_128._0_8_ = local_128 + 0x10;
                }
                else {
                  local_128._16_8_ = *psVar24;
                }
                local_128._8_8_ = plVar19[1];
                *plVar19 = (long)psVar24;
                plVar19[1] = 0;
                *(undefined1 *)(plVar19 + 2) = 0;
                std::runtime_error::runtime_error(prVar20,(string *)local_128);
                __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              goto LAB_00123f3e;
            }
LAB_00123c52:
            puVar35 = (uint *)(ulong)(uint)(int)(char)bVar1;
            goto LAB_00123cae;
          case (uint *)0xb:
            goto switchD_00123ad0_caseD_b;
          case (uint *)0xc:
            in_RSI->lex_state = ls_string;
            bVar1 = *pbVar12;
            pcVar22 = (char *)(ulong)bVar1;
            if (bVar1 < 0x62) {
              if (((bVar1 != 0x22) && (bVar1 != 0x2f)) && (bVar1 != 0x5c))
              goto switchD_00123d00_caseD_1;
              puVar35 = (uint *)(ulong)(uint)(int)(char)bVar1;
            }
            else {
              pcVar22 = (char *)(ulong)(bVar1 - 0x6e);
              switch(pcVar22) {
              case (char *)0x0:
                puVar35 = (uint *)0xa;
                break;
              case (char *)0x1:
              case (char *)0x2:
              case (char *)0x3:
              case (char *)0x5:
switchD_00123d00_caseD_1:
                in_RSI->lex_state = ls_backslash;
                goto LAB_001250c2;
              case (char *)0x4:
                puVar35 = (uint *)0xd;
                break;
              case (char *)0x6:
                puVar35 = (uint *)0x9;
                break;
              case (char *)0x7:
                in_RSI->lex_state = ls_u4;
                *local_58 = 0;
                local_58[1] = 0;
                goto LAB_00123cb3;
              default:
                if (bVar1 == 0x62) {
                  puVar35 = (uint *)0x8;
                }
                else {
                  if (bVar1 != 0x66) goto switchD_00123d00_caseD_1;
                  puVar35 = (uint *)0xc;
                }
              }
            }
            goto LAB_00123cae;
          case (uint *)0xd:
            bVar25 = bVar1 - 0x30;
            if (9 < bVar25) {
              if ((char)bVar1 < 'a') {
                if ((char)bVar1 < 'A') goto LAB_001250c2;
                bVar25 = bVar1 - 0x37;
              }
              else {
                bVar25 = bVar1 + 0xa9;
              }
              if (0xf < bVar25) goto LAB_001250c2;
            }
            uVar23 = in_RSI->u_value << 4;
            puVar35 = (uint *)(bVar25 | uVar23);
            in_RSI->u_value = (unsigned_long)puVar35;
            lVar37 = in_RSI->u_count + 1;
            in_RSI->u_count = lVar37;
            lVar31 = in_RSI->offset;
            if (lVar37 != 4) goto LAB_00123cc1;
            pSVar15 = (pointer)(lVar31 + -5);
            uVar26 = (uint)uVar23 & 0xfc00;
            local_a8 = pSVar39;
            if (uVar26 == 0xdc00) {
              if (pSVar39 != (pointer)(lVar31 + -0xb)) {
                prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::to_string(&local_108,(longlong)pSVar15);
                std::operator+(&local_e8,"JSON: offset ",&local_108);
                plVar19 = (long *)std::__cxx11::string::append((char *)&local_e8);
                local_128._0_8_ = *plVar19;
                psVar24 = (size_type *)(plVar19 + 2);
                if ((size_type *)local_128._0_8_ == psVar24) {
                  local_128._16_8_ = *psVar24;
                  local_128._24_8_ = plVar19[3];
                  local_128._0_8_ = local_128 + 0x10;
                }
                else {
                  local_128._16_8_ = *psVar24;
                }
                local_128._8_8_ = plVar19[1];
                *plVar19 = (long)psVar24;
                plVar19[1] = 0;
                *(undefined1 *)(plVar19 + 2) = 0;
                std::runtime_error::runtime_error(prVar20,(string *)local_128);
                __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              QUtil::toUTF8_abi_cxx11_
                        ((string *)local_128,
                         (QUtil *)((ulong)((uint)puVar35 & 0x3ff) +
                                   (ulong)(((uint)pJVar38 & 0x3ff) << 10) + 0x10000),(ulong)uVar26);
              puVar35 = (uint *)local_128._0_8_;
              std::__cxx11::string::_M_append((char *)pJVar33,local_128._0_8_);
              if ((JSONParser *)local_128._0_8_ != (JSONParser *)(local_128 + 0x10)) {
                puVar35 = (uint *)(local_128._16_8_ + 1);
                operator_delete((void *)local_128._0_8_,(ulong)puVar35);
              }
              pSVar15 = (pointer)0x0;
            }
            else if (uVar26 == 0xd800) {
              pJVar38 = (JSONParser *)puVar35;
              if (pSVar39 != (pointer)0x0) {
                prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::to_string(&local_a0,(longlong)pSVar15);
                std::operator+(&local_108,"JSON: offset ",&local_a0);
                plVar19 = (long *)std::__cxx11::string::append((char *)&local_108);
                local_e8._M_dataplus._M_p = (pointer)*plVar19;
                psVar24 = (size_type *)(plVar19 + 2);
                if ((size_type *)local_e8._M_dataplus._M_p == psVar24) {
                  local_e8.field_2._M_allocated_capacity = *psVar24;
                  local_e8.field_2._8_8_ = plVar19[3];
                  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                }
                else {
                  local_e8.field_2._M_allocated_capacity = *psVar24;
                }
                local_e8._M_string_length = plVar19[1];
                *plVar19 = (long)psVar24;
                plVar19[1] = 0;
                *(undefined1 *)(plVar19 + 2) = 0;
                std::__cxx11::to_string((string *)local_c8,(longlong)local_a8);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_128,&local_e8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_c8);
                std::runtime_error::runtime_error(prVar20,(string *)local_128);
                __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
            }
            else {
              QUtil::toUTF8_abi_cxx11_((string *)local_128,(QUtil *)puVar35,(ulong)uVar26);
              puVar35 = (uint *)local_128._0_8_;
              std::__cxx11::string::_M_append((char *)pJVar33,local_128._0_8_);
              pSVar15 = local_a8;
              if ((JSONParser *)local_128._0_8_ != (JSONParser *)(local_128 + 0x10)) {
                puVar35 = (uint *)(local_128._16_8_ + 1);
                operator_delete((void *)local_128._0_8_,(ulong)puVar35);
              }
            }
            in_RSI->lex_state = ls_string;
            pSVar39 = pSVar15;
            goto LAB_00123cb3;
          }
          puVar35 = (uint *)(ulong)(uint)(int)(char)*pbVar12;
        }
        else {
          if (bVar1 != 0x7b) {
            if (bVar1 != 0x7d) goto LAB_00123ab7;
            if (lVar2 != ls_string) {
              lVar30 = ls_end_dict;
              goto LAB_00123f3a;
            }
            puVar35 = (uint *)0x7d;
            goto LAB_00123cae;
          }
          if (lVar2 != ls_string) {
            if (lVar2 == ls_top) {
              lVar31 = in_RSI->offset;
              in_RSI->token_start = lVar31;
              in_RSI->lex_state = ls_begin_dict;
              goto LAB_00123f1f;
            }
            goto LAB_00123f54;
          }
          puVar35 = (uint *)0x7b;
        }
LAB_00123cae:
        std::__cxx11::string::push_back((char)pJVar33);
LAB_00123cb3:
        pbVar12 = (byte *)in_RSI->p;
        lVar31 = in_RSI->offset;
LAB_00123cc1:
        pbVar12 = pbVar12 + 1;
        in_RSI->p = (char *)pbVar12;
LAB_00123ccb:
        in_RSI->offset = lVar31 + 1;
        goto LAB_001239ab;
      }
      if (bVar1 == 0x20) {
        if (lVar2 != ls_string) goto LAB_00123a05;
        puVar35 = (uint *)0x20;
        goto LAB_00123cae;
      }
      if (bVar1 == 0x2c) {
        if (lVar2 == ls_string) {
          puVar35 = (uint *)0x2c;
          goto LAB_00123cae;
        }
      }
      else {
        if (uVar26 != 0x3a) goto LAB_00123ab7;
        if (lVar2 == ls_string) {
          puVar35 = (uint *)0x3a;
          goto LAB_00123cae;
        }
        lVar30 = ls_colon;
      }
LAB_00123f3a:
      p_Var27 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX;
      if (lVar2 == ls_top) {
LAB_00123f3e:
        in_RSI->lex_state = lVar30;
        in_RSI->p = (char *)(pbVar12 + 1);
        in_RSI->offset = in_RSI->offset + 1;
        in_RDX = (uint *)p_Var27;
        goto LAB_00123f91;
      }
LAB_00123f54:
      uVar26 = (uint)in_RDX;
      puVar35 = (uint *)pJVar34;
      if ((in_RSI->token)._M_string_length == 0) {
        if (uVar26 != 0) goto LAB_00123f91;
        goto LAB_00124758;
      }
      if (9 < uVar26) {
LAB_001250c2:
        tokenError(in_RSI);
        puVar18 = extraout_RAX;
        pbVar12 = extraout_RDX_17;
        goto LAB_001250ca;
      }
      if ((0x58U >> (uVar26 & 0x1f) & 1) == 0) {
        if ((0x202U >> (uVar26 & 0x1f) & 1) == 0) {
          if (uVar26 != 0) goto LAB_001250c2;
          prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error
                    ((logic_error *)prVar20,"tok_start set in ls_top while parsing");
LAB_00124b5b:
          puVar36 = &std::logic_error::typeinfo;
          pcVar29 = std::logic_error::~logic_error;
          goto LAB_00124d22;
        }
      }
      else {
        in_RSI->lex_state = ls_number;
      }
LAB_00123f91:
      if (in_RSI->parser_state == ps_done) {
        prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_a0,in_RSI->offset);
        std::operator+(&local_108,"JSON: offset ",&local_a0);
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_108);
        local_e8._M_dataplus._M_p = (pointer)*plVar19;
        psVar24 = (size_type *)(plVar19 + 2);
        if ((size_type *)local_e8._M_dataplus._M_p == psVar24) {
          local_e8.field_2._M_allocated_capacity = *psVar24;
          local_e8.field_2._8_8_ = plVar19[3];
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar24;
        }
        local_e8._M_string_length = plVar19[1];
        *plVar19 = (long)psVar24;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_128,&local_e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                      );
        std::runtime_error::runtime_error(prVar20,(string *)local_128);
        __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pJVar34 = pJVar33;
      if (((anonymous_namespace)::JSONParser::handleToken()::null_item == '\0') &&
         (iVar10 = __cxa_guard_acquire(&(anonymous_namespace)::JSONParser::handleToken()::null_item)
         , in_RDX = (uint *)extraout_RDX_15, iVar10 != 0)) {
        JSON::makeNull();
        puVar35 = (uint *)&(anonymous_namespace)::JSONParser::handleToken()::null_item;
        __cxa_atexit(JSON::~JSON,&(anonymous_namespace)::JSONParser::handleToken()::null_item,
                     &__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::JSONParser::handleToken()::null_item);
        in_RDX = (uint *)extraout_RDX_16;
        pJVar34 = local_80;
      }
      local_c8._0_8_ = (JSONParser *)0x0;
      local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pSVar39 = (in_RSI->stack).
                super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pJVar13 = &pSVar39[-1].item;
      if ((in_RSI->stack).
          super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
          ._M_impl.super__Vector_impl_data._M_start == pSVar39) {
        pJVar13 = (JSON *)&(anonymous_namespace)::JSONParser::handleToken()::null_item;
      }
      local_78._0_8_ =
           (pJVar13->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_78._8_8_ =
           (pJVar13->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count + 1;
        }
      }
      lVar30 = in_RSI->lex_state;
      in_RSI->lex_state = ls_top;
      switch(lVar30) {
      case ls_number:
        JVar42 = JSON::makeNumber((JSON *)local_128,(string *)pJVar34);
        _Var28._M_pi = JVar42.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
        goto LAB_00124232;
      default:
        prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_108,in_RSI->offset);
        std::operator+(&local_e8,"JSON: offset ",&local_108);
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_e8);
        local_128._0_8_ = *plVar19;
        psVar24 = (size_type *)(plVar19 + 2);
        if ((size_type *)local_128._0_8_ == psVar24) {
          local_128._16_8_ = *psVar24;
          local_128._24_8_ = plVar19[3];
          local_128._0_8_ = local_128 + 0x10;
        }
        else {
          local_128._16_8_ = *psVar24;
        }
        local_128._8_8_ = plVar19[1];
        *plVar19 = (long)psVar24;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        std::runtime_error::runtime_error(prVar20,(string *)local_128);
        __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      case ls_alpha:
        iVar10 = std::__cxx11::string::compare((char *)pJVar34);
        if (iVar10 == 0) {
          pJVar34 = (JSONParser *)0x1;
          JVar42 = JSON::makeBool((JSON *)local_128,true);
          _Var28._M_pi = JVar42.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
        }
        else {
          iVar10 = std::__cxx11::string::compare((char *)pJVar34);
          if (iVar10 == 0) {
            pJVar34 = (JSONParser *)0x0;
            JVar42 = JSON::makeBool((JSON *)local_128,false);
            _Var28._M_pi = JVar42.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
          }
          else {
            pJVar33 = (JSONParser *)0x27b2be;
            iVar10 = std::__cxx11::string::compare((char *)pJVar34);
            if (iVar10 != 0) {
              prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::to_string(&local_a0,in_RSI->offset);
              std::operator+(&local_108,"JSON: offset ",&local_a0);
              plVar19 = (long *)std::__cxx11::string::append((char *)&local_108);
              local_e8._M_dataplus._M_p = (pointer)*plVar19;
              psVar24 = (size_type *)(plVar19 + 2);
              if ((size_type *)local_e8._M_dataplus._M_p == psVar24) {
                local_e8.field_2._M_allocated_capacity = *psVar24;
                local_e8.field_2._8_8_ = plVar19[3];
                local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              }
              else {
                local_e8.field_2._M_allocated_capacity = *psVar24;
              }
              local_e8._M_string_length = plVar19[1];
              *plVar19 = (long)psVar24;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_128,&local_e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_80);
              std::runtime_error::runtime_error(prVar20,(string *)local_128);
              __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            JVar42 = JSON::makeNull();
            _Var28._M_pi = JVar42.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
            pJVar34 = pJVar33;
          }
        }
        goto LAB_00124232;
      case ls_after_string:
        if ((in_RSI->parser_state | ps_dict_after_item) != ps_dict_after_comma) {
          JVar42 = JSON::makeString((JSON *)local_128,(string *)pJVar34);
          _Var28._M_pi = JVar42.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          goto LAB_00124232;
        }
        std::__cxx11::string::_M_assign((string *)local_78._16_8_);
        in_RSI->dict_key_offset = in_RSI->token_start;
        in_RSI->parser_state = ps_dict_after_key;
        in_RDX = (uint *)extraout_RDX_01;
        break;
      case ls_begin_array:
        JVar42 = JSON::makeArray();
        _Var28._M_pi = JVar42.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
        pJVar34 = (JSONParser *)puVar35;
        goto LAB_00124232;
      case ls_end_array:
        if ((in_RSI->parser_state & ~ps_dict_begin) != ps_array_begin) {
          prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_108,in_RSI->offset);
          std::operator+(&local_e8,"JSON: offset ",&local_108);
          plVar19 = (long *)std::__cxx11::string::append((char *)&local_e8);
          local_128._0_8_ = *plVar19;
          psVar24 = (size_type *)(plVar19 + 2);
          if ((size_type *)local_128._0_8_ == psVar24) {
            local_128._16_8_ = *psVar24;
            local_128._24_8_ = plVar19[3];
            local_128._0_8_ = local_128 + 0x10;
          }
          else {
            local_128._16_8_ = *psVar24;
          }
          local_128._8_8_ = plVar19[1];
          *plVar19 = (long)psVar24;
          plVar19[1] = 0;
          *(undefined1 *)(plVar19 + 2) = 0;
          std::runtime_error::runtime_error(prVar20,(string *)local_128);
          __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pVar11 = (in_RSI->stack).
                 super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].state;
        in_RSI->parser_state = pVar11;
        if ((InputSource *)local_78._0_8_ != (InputSource *)0x0) {
          in_RDX = (uint *)in_RSI->offset;
          *(uint **)((InputSource *)local_78._0_8_)->buffer = in_RDX;
        }
        pJVar34 = (JSONParser *)puVar35;
        if (in_RSI->reactor != (Reactor *)0x0) {
          pJVar34 = (JSONParser *)local_78;
          (*in_RSI->reactor->_vptr_Reactor[4])();
          in_RDX = (uint *)extraout_RDX_00;
LAB_001241d4:
          pVar11 = in_RSI->parser_state;
        }
        goto LAB_001241da;
      case ls_begin_dict:
        JVar42 = JSON::makeDictionary();
        _Var28._M_pi = JVar42.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
        pJVar34 = (JSONParser *)puVar35;
LAB_00124232:
        this_00 = local_c8._8_8_;
        uVar9 = local_128._8_8_;
        local_c8._0_8_ = local_128._0_8_;
        local_128._0_8_ = (JSONParser *)0x0;
        local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        bVar41 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
        if ((bVar41) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00),
           _Var28._M_pi = extraout_RDX_04,
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
          _Var28._M_pi = extraout_RDX_05;
        }
        if ((JSONParser *)local_c8._0_8_ != (JSONParser *)0x0) {
          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8._0_8_ + 8))->_M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI->token_start;
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_c8._0_8_ + 0x10))->_M_allocated_capacity = in_RSI->offset;
        }
        pVar11 = in_RSI->parser_state;
        in_RDX = &switchD_0012429f::switchdataD_0025d868;
        switch(pVar11) {
        case ps_top:
          if (((JSONParser *)local_c8._0_8_ == (JSONParser *)0x0) ||
             (pVar11 = ps_done, 1 < *(int *)(*(long *)local_c8._0_8_ + 8) - 1U)) {
            pSVar39 = (in_RSI->stack).
                      super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (pSVar39 ==
                (in_RSI->stack).
                super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              pSVar15 = (in_RSI->stack).
                        super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar31 = (long)pSVar39 - (long)pSVar15;
              if (lVar31 == 0x7ffffffffffffff8) {
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              uVar14 = (lVar31 >> 3) * -0x5555555555555555;
              uVar23 = uVar14;
              if (pSVar39 == pSVar15) {
                uVar23 = 1;
              }
              p_Var40 = (_Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                         *)(uVar23 + uVar14);
              if ((_Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                   *)0x555555555555554 < p_Var40) {
                p_Var40 = (_Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                           *)0x555555555555555;
              }
              if (CARRY8(uVar23,uVar14)) {
                p_Var40 = (_Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                           *)0x555555555555555;
              }
              local_a8 = pSVar15;
              pSVar15 = std::
                        _Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                        ::_M_allocate(p_Var40,(size_t)pJVar34);
              *(undefined4 *)((long)pSVar15 + lVar31) = 9;
              *(undefined8 *)((long)pSVar15 + lVar31 + 8) = local_c8._0_8_;
              *(undefined8 *)((long)pSVar15 + lVar31 + 0x10) = local_c8._8_8_;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(_Atomic_word *)(local_c8._8_8_ + 8) = *(_Atomic_word *)(local_c8._8_8_ + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(_Atomic_word *)(local_c8._8_8_ + 8) = *(_Atomic_word *)(local_c8._8_8_ + 8) + 1;
                }
              }
              in_RDX = (uint *)0x0;
              pSVar32 = pSVar15;
              for (pSVar16 = local_a8; pSVar39 != pSVar16; pSVar16 = pSVar16 + 1) {
                pSVar32->state = pSVar16->state;
                uVar5 = *(undefined4 *)
                         &(pSVar16->item).m.
                          super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                uVar6 = *(undefined4 *)
                         ((long)&(pSVar16->item).m.
                                 super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 4);
                uVar7 = *(undefined4 *)
                         &(pSVar16->item).m.
                          super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi;
                uVar8 = *(undefined4 *)
                         ((long)&(pSVar16->item).m.
                                 super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi + 4);
                (pSVar16->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                *(undefined4 *)
                 &(pSVar32->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = uVar5;
                *(undefined4 *)
                 ((long)&(pSVar32->item).m.
                         super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
                     uVar6;
                *(undefined4 *)
                 &(pSVar32->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = uVar7;
                *(undefined4 *)
                 ((long)&(pSVar32->item).m.
                         super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 4) = uVar8;
                (pSVar16->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
                pSVar32 = pSVar32 + 1;
              }
              if (local_a8 != (pointer)0x0) {
                pJVar34 = (JSONParser *)
                          ((long)(in_RSI->stack).
                                 super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)local_a8
                          );
                operator_delete(local_a8,(ulong)pJVar34);
                in_RDX = (uint *)extraout_RDX_12;
              }
              (in_RSI->stack).
              super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
              ._M_impl.super__Vector_impl_data._M_start = pSVar15;
              (in_RSI->stack).
              super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
              ._M_impl.super__Vector_impl_data._M_finish = pSVar32 + 1;
              (in_RSI->stack).
              super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar15 + (long)p_Var40;
            }
            else {
              pSVar39->state = ps_done;
              (pSVar39->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)local_c8._0_8_;
              (pSVar39->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(_Atomic_word *)(local_c8._8_8_ + 8) = *(_Atomic_word *)(local_c8._8_8_ + 8) + 1;
                  UNLOCK();
                  pSVar39 = (in_RSI->stack).
                            super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
                else {
                  *(_Atomic_word *)(local_c8._8_8_ + 8) = *(_Atomic_word *)(local_c8._8_8_ + 8) + 1;
                }
              }
              (in_RSI->stack).
              super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
              ._M_impl.super__Vector_impl_data._M_finish = pSVar39 + 1;
            }
            in_RSI->parser_state = ps_done;
            goto LAB_0012472f;
          }
          goto LAB_0012434d;
        case ps_dict_begin:
        case ps_dict_after_comma:
          pJVar33 = (JSONParser *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_108,in_RSI->offset);
          std::operator+(&local_e8,"JSON: offset ",&local_108);
          puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
          local_128._0_8_ = local_128 + 0x10;
          pbVar12 = (byte *)*puVar18;
          pcVar22 = (char *)(puVar18 + 2);
          if (pbVar12 == (byte *)pcVar22) {
            local_128._16_8_ = *(undefined8 *)pcVar22;
            local_128._24_8_ = puVar18[3];
          }
          else {
LAB_001250ca:
            local_128._16_8_ = *(undefined8 *)pcVar22;
            local_128._0_8_ = pbVar12;
          }
          local_128._8_8_ = puVar18[1];
          *puVar18 = pcVar22;
          puVar18[1] = 0;
          *(undefined1 *)(puVar18 + 2) = 0;
          std::runtime_error::runtime_error((runtime_error *)pJVar33,(string *)local_128);
          __cxa_throw(pJVar33,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        case ps_dict_after_key:
          prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_108,in_RSI->offset);
          std::operator+(&local_e8,"JSON: offset ",&local_108);
          plVar19 = (long *)std::__cxx11::string::append((char *)&local_e8);
          local_128._0_8_ = *plVar19;
          psVar24 = (size_type *)(plVar19 + 2);
          if ((size_type *)local_128._0_8_ == psVar24) {
            local_128._16_8_ = *psVar24;
            local_128._24_8_ = plVar19[3];
            local_128._0_8_ = local_128 + 0x10;
          }
          else {
            local_128._16_8_ = *psVar24;
          }
          local_128._8_8_ = plVar19[1];
          *plVar19 = (long)psVar24;
          plVar19[1] = 0;
          *(undefined1 *)(plVar19 + 2) = 0;
          std::runtime_error::runtime_error(prVar20,(string *)local_128);
          __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        case ps_dict_after_colon:
          pRVar3 = in_RSI->reactor;
          if (pRVar3 != (Reactor *)0x0) {
            pJVar34 = (JSONParser *)local_78._16_8_;
            iVar10 = (*pRVar3->_vptr_Reactor[6])(pRVar3,local_78._16_8_,local_c8);
            pVar11 = ps_dict_after_item;
            in_RDX = (uint *)extraout_RDX_07;
            if ((char)iVar10 != '\0') goto LAB_0012434d;
          }
          pJVar34 = (JSONParser *)local_78;
          JVar42 = JSON::addDictionaryMember(&local_40,(string *)pJVar34,(JSON *)local_78._16_8_);
          in_RDX = JVar42.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          pVar11 = ps_dict_after_item;
          _Var28._M_pi = local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          break;
        case ps_dict_after_item:
          prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_108,in_RSI->offset);
          std::operator+(&local_e8,"JSON: offset ",&local_108);
          plVar19 = (long *)std::__cxx11::string::append((char *)&local_e8);
          local_128._0_8_ = *plVar19;
          psVar24 = (size_type *)(plVar19 + 2);
          if ((size_type *)local_128._0_8_ == psVar24) {
            local_128._16_8_ = *psVar24;
            local_128._24_8_ = plVar19[3];
            local_128._0_8_ = local_128 + 0x10;
          }
          else {
            local_128._16_8_ = *psVar24;
          }
          local_128._8_8_ = plVar19[1];
          *plVar19 = (long)psVar24;
          plVar19[1] = 0;
          *(undefined1 *)(plVar19 + 2) = 0;
          std::runtime_error::runtime_error(prVar20,(string *)local_128);
          __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        case ps_array_begin:
        case ps_array_after_comma:
          if (in_RSI->reactor != (Reactor *)0x0) {
            pJVar34 = (JSONParser *)local_c8;
            iVar10 = (*in_RSI->reactor->_vptr_Reactor[7])();
            pVar11 = ps_array_after_item;
            in_RDX = (uint *)extraout_RDX_06;
            if ((char)iVar10 != '\0') goto LAB_0012434d;
          }
          pJVar34 = (JSONParser *)local_78;
          JVar42 = JSON::addArrayElement(&local_50,(JSON *)pJVar34);
          in_RDX = JVar42.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          pVar11 = ps_array_after_item;
          _Var28._M_pi = local_50.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          break;
        case ps_array_after_item:
          prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_108,in_RSI->offset);
          std::operator+(&local_e8,"JSON: offset ",&local_108);
          plVar19 = (long *)std::__cxx11::string::append((char *)&local_e8);
          local_128._0_8_ = *plVar19;
          psVar24 = (size_type *)(plVar19 + 2);
          if ((size_type *)local_128._0_8_ == psVar24) {
            local_128._16_8_ = *psVar24;
            local_128._24_8_ = plVar19[3];
            local_128._0_8_ = local_128 + 0x10;
          }
          else {
            local_128._16_8_ = *psVar24;
          }
          local_128._8_8_ = plVar19[1];
          *plVar19 = (long)psVar24;
          plVar19[1] = 0;
          *(undefined1 *)(plVar19 + 2) = 0;
          std::runtime_error::runtime_error(prVar20,(string *)local_128);
          __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        case ps_done:
          this_01 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this_01,"JSONParser::handleToken: unexpected parser state");
          __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        default:
          goto switchD_0012429f_default;
        }
        if (_Var28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var28._M_pi);
          in_RDX = (uint *)extraout_RDX_08;
        }
LAB_0012434d:
        in_RSI->parser_state = pVar11;
        _Var28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX;
switchD_0012429f_default:
        in_RDX = (uint *)_Var28._M_pi;
        if (((JSONParser *)local_c8._0_8_ != (JSONParser *)0x0) &&
           (*(int *)(*(long *)local_c8._0_8_ + 8) - 1U < 2)) {
          pSVar39 = (in_RSI->stack).
                    super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (pSVar39 ==
              (in_RSI->stack).
              super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            pSVar15 = (in_RSI->stack).
                      super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar31 = (long)pSVar39 - (long)pSVar15;
            if (lVar31 == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar14 = (lVar31 >> 3) * -0x5555555555555555;
            uVar23 = uVar14;
            if (pSVar39 == pSVar15) {
              uVar23 = 1;
            }
            p_Var40 = (_Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                       *)(uVar23 + uVar14);
            if ((_Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                 *)0x555555555555554 < p_Var40) {
              p_Var40 = (_Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                         *)0x555555555555555;
            }
            if (CARRY8(uVar23,uVar14)) {
              p_Var40 = (_Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                         *)0x555555555555555;
            }
            local_a8 = pSVar15;
            pSVar15 = std::
                      _Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                      ::_M_allocate(p_Var40,(size_t)pJVar34);
            *(parser_state_e *)((long)pSVar15 + lVar31) = in_RSI->parser_state;
            *(undefined8 *)((long)pSVar15 + lVar31 + 8) = local_c8._0_8_;
            *(undefined8 *)((long)pSVar15 + lVar31 + 0x10) = local_c8._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_c8._8_8_ + 8) = *(_Atomic_word *)(local_c8._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_c8._8_8_ + 8) = *(_Atomic_word *)(local_c8._8_8_ + 8) + 1;
              }
            }
            in_RDX = (uint *)0x0;
            pSVar32 = pSVar15;
            for (pSVar16 = local_a8; pSVar39 != pSVar16; pSVar16 = pSVar16 + 1) {
              pSVar32->state = pSVar16->state;
              uVar5 = *(undefined4 *)
                       &(pSVar16->item).m.
                        super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              uVar6 = *(undefined4 *)
                       ((long)&(pSVar16->item).m.
                               super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       + 4);
              uVar7 = *(undefined4 *)
                       &(pSVar16->item).m.
                        super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi;
              uVar8 = *(undefined4 *)
                       ((long)&(pSVar16->item).m.
                               super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi + 4);
              (pSVar16->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              *(undefined4 *)
               &(pSVar32->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = uVar5;
              *(undefined4 *)
               ((long)&(pSVar32->item).m.
                       super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
                   uVar6;
              *(undefined4 *)
               &(pSVar32->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = uVar7;
              *(undefined4 *)
               ((long)&(pSVar32->item).m.
                       super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi + 4) = uVar8;
              (pSVar16->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)0x0;
              pSVar32 = pSVar32 + 1;
            }
            if (local_a8 != (pointer)0x0) {
              pJVar34 = (JSONParser *)
                        ((long)(in_RSI->stack).
                               super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)local_a8);
              operator_delete(local_a8,(ulong)pJVar34);
              in_RDX = (uint *)extraout_RDX_09;
            }
            pSVar39 = pSVar32 + 1;
            (in_RSI->stack).
            super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
            ._M_impl.super__Vector_impl_data._M_start = pSVar15;
            (in_RSI->stack).
            super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
            ._M_impl.super__Vector_impl_data._M_finish = pSVar39;
            (in_RSI->stack).
            super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar15 + (long)p_Var40;
          }
          else {
            pSVar39->state = pVar11;
            (pSVar39->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_c8._0_8_;
            (pSVar39->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_c8._8_8_ + 8) = *(_Atomic_word *)(local_c8._8_8_ + 8) + 1;
                UNLOCK();
                pSVar39 = (in_RSI->stack).
                          super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                *(_Atomic_word *)(local_c8._8_8_ + 8) = *(_Atomic_word *)(local_c8._8_8_ + 8) + 1;
              }
            }
            pSVar39 = pSVar39 + 1;
            (in_RSI->stack).
            super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
            ._M_impl.super__Vector_impl_data._M_finish = pSVar39;
          }
          if ((JSONParser *)local_c8._0_8_ != (JSONParser *)0x0) {
            if (*(int *)(*(long *)local_c8._0_8_ + 8) == 2) {
              pVar11 = ps_array_begin;
              if (in_RSI->reactor != (Reactor *)0x0) {
                (*in_RSI->reactor->_vptr_Reactor[3])();
                in_RDX = (uint *)extraout_RDX_11;
              }
            }
            else {
              if (*(int *)(*(long *)local_c8._0_8_ + 8) != 1) goto LAB_0012466c;
              pVar11 = ps_dict_begin;
              if (in_RSI->reactor != (Reactor *)0x0) {
                (*in_RSI->reactor->_vptr_Reactor[2])();
                in_RDX = (uint *)extraout_RDX_10;
              }
            }
            in_RSI->parser_state = pVar11;
            pSVar39 = (in_RSI->stack).
                      super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
LAB_0012466c:
          if (500 < (ulong)(((long)pSVar39 -
                             (long)(in_RSI->stack).
                                   super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555)) {
            prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::to_string(&local_108,in_RSI->offset);
            std::operator+(&local_e8,"JSON: offset ",&local_108);
            plVar19 = (long *)std::__cxx11::string::append((char *)&local_e8);
            local_128._0_8_ = *plVar19;
            psVar24 = (size_type *)(plVar19 + 2);
            if ((size_type *)local_128._0_8_ == psVar24) {
              local_128._16_8_ = *psVar24;
              local_128._24_8_ = plVar19[3];
              local_128._0_8_ = local_128 + 0x10;
            }
            else {
              local_128._16_8_ = *psVar24;
            }
            local_128._8_8_ = plVar19[1];
            *plVar19 = (long)psVar24;
            plVar19[1] = 0;
            *(undefined1 *)(plVar19 + 2) = 0;
            std::runtime_error::runtime_error(prVar20,(string *)local_128);
            __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        break;
      case ls_end_dict:
        if ((in_RSI->parser_state != ps_dict_begin) && (in_RSI->parser_state != ps_dict_after_item))
        {
          prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_108,in_RSI->offset);
          std::operator+(&local_e8,"JSON: offset ",&local_108);
          plVar19 = (long *)std::__cxx11::string::append((char *)&local_e8);
          local_128._0_8_ = *plVar19;
          psVar24 = (size_type *)(plVar19 + 2);
          if ((size_type *)local_128._0_8_ == psVar24) {
            local_128._16_8_ = *psVar24;
            local_128._24_8_ = plVar19[3];
            local_128._0_8_ = local_128 + 0x10;
          }
          else {
            local_128._16_8_ = *psVar24;
          }
          local_128._8_8_ = plVar19[1];
          *plVar19 = (long)psVar24;
          plVar19[1] = 0;
          *(undefined1 *)(plVar19 + 2) = 0;
          std::runtime_error::runtime_error(prVar20,(string *)local_128);
          __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pVar11 = (in_RSI->stack).
                 super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].state;
        in_RSI->parser_state = pVar11;
        if ((InputSource *)local_78._0_8_ != (InputSource *)0x0) {
          in_RDX = (uint *)in_RSI->offset;
          *(uint **)((InputSource *)local_78._0_8_)->buffer = in_RDX;
        }
        pJVar34 = (JSONParser *)puVar35;
        if (in_RSI->reactor != (Reactor *)0x0) {
          pJVar34 = (JSONParser *)local_78;
          (*in_RSI->reactor->_vptr_Reactor[4])();
          in_RDX = (uint *)extraout_RDX_02;
          goto LAB_001241d4;
        }
LAB_001241da:
        if (pVar11 != ps_done) {
          pSVar39 = (in_RSI->stack).
                    super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          (in_RSI->stack).
          super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
          ._M_impl.super__Vector_impl_data._M_finish = pSVar39 + -1;
          p_Var27 = pSVar39[-1].item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var27);
            in_RDX = (uint *)extraout_RDX_03;
          }
        }
        break;
      case ls_colon:
        if (in_RSI->parser_state != ps_dict_after_key) {
          prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_108,in_RSI->offset);
          std::operator+(&local_e8,"JSON: offset ",&local_108);
          plVar19 = (long *)std::__cxx11::string::append((char *)&local_e8);
          local_128._0_8_ = *plVar19;
          psVar24 = (size_type *)(plVar19 + 2);
          if ((size_type *)local_128._0_8_ == psVar24) {
            local_128._16_8_ = *psVar24;
            local_128._24_8_ = plVar19[3];
            local_128._0_8_ = local_128 + 0x10;
          }
          else {
            local_128._16_8_ = *psVar24;
          }
          local_128._8_8_ = plVar19[1];
          *plVar19 = (long)psVar24;
          plVar19[1] = 0;
          *(undefined1 *)(plVar19 + 2) = 0;
          std::runtime_error::runtime_error(prVar20,(string *)local_128);
          __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        in_RSI->parser_state = ps_dict_after_colon;
        pJVar34 = (JSONParser *)puVar35;
        break;
      case ls_comma:
        pVar11 = ps_dict_after_comma;
        if (in_RSI->parser_state != ps_dict_after_item) {
          if (in_RSI->parser_state != ps_array_after_item) {
            prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::to_string(&local_108,in_RSI->offset);
            std::operator+(&local_e8,"JSON: offset ",&local_108);
            plVar19 = (long *)std::__cxx11::string::append((char *)&local_e8);
            local_128._0_8_ = *plVar19;
            psVar24 = (size_type *)(plVar19 + 2);
            if ((size_type *)local_128._0_8_ == psVar24) {
              local_128._16_8_ = *psVar24;
              local_128._24_8_ = plVar19[3];
              local_128._0_8_ = local_128 + 0x10;
            }
            else {
              local_128._16_8_ = *psVar24;
            }
            local_128._8_8_ = plVar19[1];
            *plVar19 = (long)psVar24;
            plVar19[1] = 0;
            *(undefined1 *)(plVar19 + 2) = 0;
            std::runtime_error::runtime_error(prVar20,(string *)local_128);
            __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pVar11 = ps_array_after_comma;
        }
        in_RSI->parser_state = pVar11;
        pJVar34 = (JSONParser *)puVar35;
      }
LAB_0012472f:
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
        in_RDX = (uint *)extraout_RDX_13;
      }
      pJVar33 = local_80;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
        in_RDX = (uint *)extraout_RDX_14;
        pJVar33 = local_80;
      }
LAB_00124758:
      puVar35 = (uint *)pJVar34;
    } while (in_RSI->done != true);
  }
  pJVar33 = local_60;
  if (in_RSI->parser_state == ps_done) {
    pSVar39 = (in_RSI->stack).
              super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pIVar17 = (InputSource *)
              pSVar39[-1].item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if ((in_RSI->reactor != (Reactor *)0x0) &&
       ((pIVar17 == (InputSource *)0x0 ||
        (1 < *(int *)((long)(((unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>
                               *)&pIVar17->_vptr_InputSource)->_M_t).
                            super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>
                     + 8) - 1U)))) {
      (*in_RSI->reactor->_vptr_Reactor[5])();
      pIVar17 = (InputSource *)
                pSVar39[-1].item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      in_RDX = (uint *)extraout_RDX;
    }
    pJVar33->is = pIVar17;
    peVar4 = (element_type *)
             pSVar39[-1].item.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    pJVar33->reactor = (Reactor *)peVar4;
    if (peVar4 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&peVar4->start = (int)peVar4->start + 1;
        UNLOCK();
      }
      else {
        *(int *)&peVar4->start = (int)peVar4->start + 1;
      }
    }
    JVar42.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX;
    JVar42.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    return (JSON)JVar42.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
  }
  prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar20,"JSON: premature end of input");
  puVar36 = &std::runtime_error::typeinfo;
  pcVar29 = std::runtime_error::~runtime_error;
LAB_00124d22:
  __cxa_throw(prVar20,puVar36,pcVar29);
}

Assistant:

JSON
JSONParser::parse()
{
    while (!done) {
        getToken();
        handleToken();
    }
    if (parser_state != ps_done) {
        QTC::TC("libtests", "JSON parse premature EOF");
        throw std::runtime_error("JSON: premature end of input");
    }
    auto const& tos = stack.back().item;
    if (reactor && !(tos.isArray() || tos.isDictionary())) {
        reactor->topLevelScalar();
    }
    return tos;
}